

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O3

bool __thiscall dh::scanner::scan(scanner *this,FILE *fp)

{
  undefined1 uVar1;
  uint uVar2;
  ostream *this_00;
  long *plVar3;
  byte bVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  string tmp;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  vector<dh::token,_std::allocator<dh::token>_> *local_268;
  token local_260;
  int local_234;
  string local_230 [4];
  string local_1b0 [12];
  
  destroy(this);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288);
  if (fp != (FILE *)0x0) {
    do {
      do {
        uVar2 = fgetc((FILE *)fp);
      } while ((char)uVar2 == '\t');
    } while ((uVar2 & 0xff) == 0x20);
    if ((uVar2 & 0xff) != 0xff) {
      local_268 = &this->_tokens;
      uVar8 = 0;
      iVar7 = 0;
      do {
        local_234 = uVar8 + 0x3d;
        uVar5 = (ulong)uVar2;
        while( true ) {
          bVar4 = (byte)uVar5;
          if (bVar4 == 10 && (char)uVar8 != '\r' || bVar4 == 0xd) {
            this->line = this->line + 1;
          }
          if (iVar7 != 5) break;
          uVar2 = uVar8 & 0xff;
          if (uVar2 < 0x5b) {
            if (uVar2 - 0x20 < 0x1f) {
              uVar1 = (*(code *)(&DAT_0012a080 + *(int *)(&DAT_0012a080 + (ulong)(uVar2 - 0x20) * 4)
                                ))();
              return (bool)uVar1;
            }
            if ((uVar2 - 9 < 2) || (uVar2 == 0xd)) goto LAB_0010b02b;
LAB_0010b1c8:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"[ERROR] Unexpected Token \"",0x1a);
            local_260._val._M_dataplus._M_p._0_1_ = (char)uVar8;
            this_00 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)&local_260,1);
            std::__ostream_insert<char,std::char_traits<char>>(this_00,"\" in line ",10);
            plVar3 = (long *)std::ostream::operator<<(this_00,this->line);
            std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
            std::ostream::put((char)plVar3);
            std::ostream::flush();
LAB_0010b79e:
            this->rightflag = false;
          }
          else {
            uVar2 = uVar2 - 0x5b;
            if (0x22 < uVar2) goto LAB_0010b1c8;
            if ((0x500000005U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
              if ((ulong)uVar2 != 0x21) goto LAB_0010b1c8;
              local_280 = 0;
              *local_288 = 0;
              if (bVar4 == 0x7c) {
                std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,0x12a29e);
                local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b0,local_288,local_288 + local_280);
                token::token(&local_260,local_1b0,LOGICALOP,this->line);
                std::vector<dh::token,_std::allocator<dh::token>_>::emplace_back<dh::token>
                          (local_268,&local_260);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_260._val._M_dataplus._M_p._1_7_,
                                (char)local_260._val._M_dataplus._M_p) != &local_260._val.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_260._val._M_dataplus._M_p._1_7_,
                                           (char)local_260._val._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
                  operator_delete(local_1b0[0]._M_dataplus._M_p);
                }
                local_280 = 0;
                *local_288 = 0;
                uVar2 = fgetc((FILE *)fp);
                uVar5 = (ulong)uVar2;
                goto LAB_0010b02b;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"[ERROR] Incompleted Logical operator \"|\"",0x28);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr," near line ",0xb);
              plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,this->line);
              std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
              std::ostream::put((char)plVar3);
              std::ostream::flush();
              goto LAB_0010b79e;
            }
            local_280 = 0;
            *local_288 = 0;
            std::__cxx11::string::_M_replace_aux((ulong)&local_288,0,0,'\x01');
            local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_230,local_288,local_288 + local_280);
            token::token(&local_260,local_230,SEPOP,this->line);
            std::vector<dh::token,_std::allocator<dh::token>_>::emplace_back<dh::token>
                      (local_268,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_260._val._M_dataplus._M_p._1_7_,
                            (char)local_260._val._M_dataplus._M_p) != &local_260._val.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_260._val._M_dataplus._M_p._1_7_,
                                       (char)local_260._val._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
              operator_delete(local_230[0]._M_dataplus._M_p);
            }
            local_280 = 0;
            *local_288 = 0;
          }
LAB_0010b02b:
          iVar7 = 0;
          if (((char)uVar5 == '\n') || (uVar2 = (uint)uVar5 & 0xff, uVar2 == 0xd)) {
            this->line = this->line + -1;
          }
          else if (uVar2 == 0xff) goto LAB_0010bf40;
        }
        uVar8 = (uint)uVar5;
        if ((0x20 < bVar4) || (iVar7 = 0, (0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
          cVar6 = (char)&local_288;
          if (((uVar8 & 0xff) == 0x5f) || ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a)) {
            iVar7 = 1;
            std::__cxx11::string::push_back(cVar6);
          }
          else if ((byte)(bVar4 - 0x30) < 10) {
            iVar7 = 2;
            std::__cxx11::string::push_back(cVar6);
          }
          else if (bVar4 == 0x2e) {
            iVar7 = 3;
            std::__cxx11::string::push_back(cVar6);
          }
          else {
            iVar7 = 5;
            if ((uVar8 & 0xff) == 0x22) {
              iVar7 = 4;
              std::__cxx11::string::push_back(cVar6);
            }
          }
        }
        uVar2 = fgetc((FILE *)fp);
      } while ((char)uVar2 != -1);
    }
LAB_0010bf40:
    (this->_it)._M_current =
         (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->scanflag = true;
    fclose((FILE *)fp);
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  return fp != (FILE *)0x0;
}

Assistant:

bool scanner::scan(::std::FILE *fp)
{
	this->reset();

	STATE state = STATE::START;
	char cur = 0;
	char lastch = 0;
	::std::string tmp = "";

	if ( fp == NULL)
	{
		return false;
	}

	cur = ::std::fgetc(fp);
	while( cur == ' ' || cur == '\t') cur = ::std::fgetc(fp);

	// DFA implement
	while( cur != EOF)
	{
		if ( cur == '\n' && lastch != '\r')
		{
			++line;
		} else if ( cur == '\r')
		{
			++line;
		}

		// core part
		switch(state)
		{
			case STATE::START:
				if ( cur == ' ' || cur == '\t'
						|| cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else if ( cur == '_' 
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z'))
				{
					state = STATE::INID;
					tmp += cur;
				} else if ( cur >= '0' && cur <= '9')
				{
					state = STATE::ININT;
					tmp += cur;
				} else if ( cur == '\"') 
				{
					state = STATE::INSTRING;
					tmp += cur;
				} else if ( cur == '.') 
				{
					state = STATE::INFLOAT;
					tmp += cur;
				}
				else 
				{
					state = STATE::DONE;
				}
				lastch = cur;
				break;
			case INID:
				if ( cur == '_'
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z')
						|| ( cur >= '0' && cur <= '9'))
				{
					state = STATE::INID;
					tmp += cur;
				} else 
				{
					state = STATE::DONE;
					
					TYPE tmp_type = TYPE::ID;
					if ( tmp == "boolean")
					{
						tmp_type = TYPE::BOOLEAN;
					} else if ( tmp == "break")
					{
						tmp_type = TYPE::BREAK;
					} else if ( tmp == "continue")
					{
						tmp_type = TYPE::CONTINUE;
					} else if ( tmp == "else")
					{
						tmp_type = TYPE::ELSE;
					} else if ( tmp == "for")
					{
						tmp_type = TYPE::FOR;
					} else if ( tmp == "float")
					{
						tmp_type = TYPE::FLOAT;
					} else if ( tmp == "if")
					{
						tmp_type = TYPE::IF;
					} else if ( tmp == "int")
					{
						tmp_type = TYPE::INT;
					} else if ( tmp == "return")
					{
						tmp_type = TYPE::RETURN;
					} else if ( tmp == "void")
					{
						tmp_type = TYPE::VOID;
					} else if ( tmp == "while")
					{
						tmp_type = TYPE::WHILE;
					} else if ( tmp == "true" || tmp == "false")
					{
						tmp_type = TYPE::NUMBOOLEAN;
					} else 
					{
						tmp_type = TYPE::ID;
					}
					_tokens.push_back( token( tmp, tmp_type, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::ININT:
				if ( cur >= '0' && cur <= '9')
				{
					tmp += cur;
					state = STATE::ININT;
				} else if ( cur == '.')
				{
					state = STATE::INFLOAT;
					tmp += cur;
				} else if ( cur == 'E' || cur == 'e')
				{
					tmp += cur;
					state = STATE::INFLOAT;
				} else 
				{
					state = STATE::DONE;
					
					_tokens.push_back( token( tmp, TYPE::NUMINT, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::INFLOAT:
				if ( lastch == '.')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						state = STATE::DONE;

						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == 'E' || lastch == 'e')
				{
					if ( cur == '+' || cur == '-')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else if ( cur >= '0' && cur <= '9')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else 
					{
						state = STATE::START;
						::std::cerr << "[ERROR] Incompleted float-literal \"" 
							<< tmp
							<< "\" near line " 
							<< line << ::std::endl;
						tmp.clear();
						rightflag = false;
					}
				} else if( lastch >= '0' && lastch <= '9')
				{
					if ( cur == 'E' || cur == 'e')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else
					{
						state = STATE::DONE;
						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == '+' || lastch == '-')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						::std::cerr << "[ERROR] Incompleted float-literal \""
							<< tmp
							<< "\" near line "
							<< line
							<< ::std::endl;
						tmp.clear();
						rightflag = false;
						state = STATE::START;
					}
				}
				lastch = cur;
				break;
			case STATE::INMULTICOMMENT:
				if ( lastch == '*' && cur == '/')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INMULTICOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSINGLECOMMENT:
				if (cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INSINGLECOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSTRING:
				if ( cur == '\"' && lastch != '\\')
				{
					state = STATE::START;

					_tokens.push_back( token( tmp, TYPE::STRING, line));
					tmp.clear();
				} else 
				{
					state = STATE::INSTRING;
					if ( cur != '\n' && cur != '\r')
					{
						tmp += cur;
					}
				}
				lastch = cur;
				break;
			case STATE::DONE:
				switch(lastch)
				{
					case ' ':
					case '\t':
					case '\r':
					case '\n':
						break;
					case '=':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::ASSINGOP, line));
							tmp.clear();
						}
						break;
					case '!':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = "!=";

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();
						}
						break;
					case '>':
					case '<':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();
						}
						break;
					case '|':
						if ( cur == '|')
						{
							tmp.clear();
							tmp = "||";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"|\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '&':
						if ( cur == '&')
						{
							tmp.clear();
							tmp = "&&";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"&\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '/':
						if ( cur == '/')
						{
							state = STATE::INSINGLECOMMENT;
							continue;
						} else if ( cur == '*'){
							state = STATE::INMULTICOMMENT;
							continue;
						}
					case '*':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::MULOP, line));
						tmp.clear();
						break;
					case '+':
					case '-':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::ADDOP, line));
						tmp.clear();
						break;
					case '{':
					case '}':
					case '[':
					case ']':
					case '(':
					case ')':
					case ',':
					case ';':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::SEPOP, line));
						tmp.clear();
						break;
					default:
						::std::cerr << "[ERROR] Unexpected Token \""
							<< lastch
							<< "\" in line "
							<< line
							<< ::std::endl;
						rightflag = false;
						break;
				}
				if (cur == '\n' || cur == '\r')
				{
					--line;
				}
				state = STATE::START;
				continue;
		}
		cur = ::std::fgetc(fp);
	}
	_it = _tokens.begin();
	scanflag = true;;
	fclose(fp);
	return true;
}